

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O3

DataType __thiscall draco::PlyReader::GetDataTypeFromString(PlyReader *this,string *name)

{
  int iVar1;
  DataType DVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  DVar2 = DT_INT8;
  if ((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)name), iVar1 != 0)) {
    iVar1 = std::__cxx11::string::compare((char *)name);
    DVar2 = DT_UINT8;
    if ((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)name), iVar1 != 0)) {
      iVar1 = std::__cxx11::string::compare((char *)name);
      DVar2 = DT_INT16;
      if ((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)name), iVar1 != 0)) {
        iVar1 = std::__cxx11::string::compare((char *)name);
        DVar2 = DT_UINT16;
        if ((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)name), iVar1 != 0)) {
          iVar1 = std::__cxx11::string::compare((char *)name);
          DVar2 = DT_INT32;
          if ((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)name), iVar1 != 0)) {
            iVar1 = std::__cxx11::string::compare((char *)name);
            DVar2 = DT_UINT32;
            if ((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)name), iVar1 != 0)) {
              iVar1 = std::__cxx11::string::compare((char *)name);
              DVar2 = DT_FLOAT32;
              if ((iVar1 != 0) && (iVar1 = std::__cxx11::string::compare((char *)name), iVar1 != 0))
              {
                iVar1 = std::__cxx11::string::compare((char *)name);
                if (iVar1 == 0) {
                  DVar2 = DT_FLOAT64;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)name);
                  DVar2 = DT_FLOAT64;
                  if (iVar1 != 0) {
                    DVar2 = DT_INVALID;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return DVar2;
}

Assistant:

DataType PlyReader::GetDataTypeFromString(const std::string &name) const {
  if (name == "char" || name == "int8") {
    return DT_INT8;
  }
  if (name == "uchar" || name == "uint8") {
    return DT_UINT8;
  }
  if (name == "short" || name == "int16") {
    return DT_INT16;
  }
  if (name == "ushort" || name == "uint16") {
    return DT_UINT16;
  }
  if (name == "int" || name == "int32") {
    return DT_INT32;
  }
  if (name == "uint" || name == "uint32") {
    return DT_UINT32;
  }
  if (name == "float" || name == "float32") {
    return DT_FLOAT32;
  }
  if (name == "double" || name == "float64") {
    return DT_FLOAT64;
  }
  return DT_INVALID;
}